

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O0

char * leveldb::GetVarint32Ptr(char *p,char *limit,uint32_t *value)

{
  uint32_t result;
  uint32_t *value_local;
  char *limit_local;
  char *p_local;
  
  if ((p < limit) && ((*p & 0x80U) == 0)) {
    *value = (uint)(byte)*p;
    p_local = p + 1;
  }
  else {
    p_local = GetVarint32PtrFallback(p,limit,value);
  }
  return p_local;
}

Assistant:

inline const char* GetVarint32Ptr(const char* p, const char* limit,
                                  uint32_t* value) {
  if (p < limit) {
    uint32_t result = *(reinterpret_cast<const uint8_t*>(p));
    if ((result & 128) == 0) {
      *value = result;
      return p + 1;
    }
  }
  return GetVarint32PtrFallback(p, limit, value);
}